

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_godunov_plm.cpp
# Opt level: O3

void PLM::PredictVelOnZFace
               (Box *zebox,int ncomp,Array4<double> *Imz,Array4<double> *Ipz,Array4<const_double> *q
               ,Array4<const_double> *vcc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  double *pdVar16;
  long lVar17;
  pair<bool,_bool> pVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  double *pdVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  double *pdVar28;
  ulong uVar29;
  double *pdVar30;
  double *pdVar31;
  int iVar32;
  double *pdVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  double *pdVar43;
  double *pdVar44;
  double *pdVar45;
  bool bVar46;
  bool bVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  undefined1 auVar51 [16];
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  double dVar58;
  double dVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  Real qp;
  undefined4 uVar70;
  undefined4 uVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  Real qp_1;
  Real qk_1;
  BCRec *bc;
  double *local_230;
  double *local_228;
  double *local_220;
  double *local_208;
  double *local_1d0;
  double *local_1c8;
  double *local_1c0;
  double *local_1b8;
  double *local_1b0;
  double *local_1a8;
  ulong local_190;
  double *local_120;
  double *local_118;
  double *local_110;
  double *local_108;
  double *local_100;
  double *local_f8;
  double *local_f0;
  double *local_e8;
  double *local_d8;
  
  dVar48 = dt / (geom->super_CoordSys).dx[2];
  iVar3 = (geom->domain).smallend.vect[2];
  iVar4 = (geom->domain).bigend.vect[2];
  pVar18 = anon_unknown.dwarf_4c2856::has_extdir_or_ho
                     ((h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
                      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                      super__Vector_impl_data._M_start,ncomp,2);
  if ((((ushort)pVar18 & 1) == 0) || (iVar5 = (zebox->smallend).vect[2], iVar3 < iVar5 + -1)) {
    iVar5 = (zebox->bigend).vect[2];
    if (iVar5 < iVar4 || ((ushort)pVar18 >> 8 & 1) == 0) {
      if (ncomp < 1) {
        return;
      }
      lVar13 = Ipz->jstride;
      lVar14 = Imz->jstride;
      iVar3 = (zebox->smallend).vect[1];
      lVar40 = (long)iVar3;
      iVar4 = (zebox->smallend).vect[0];
      lVar38 = (long)iVar4;
      lVar36 = vcc->nstride * 0x10 + (lVar40 - (vcc->begin).y) * vcc->jstride * 8 + lVar38 * 8 +
               (long)(vcc->begin).x * -8;
      lVar15 = q->jstride;
      local_1a8 = Ipz->p + (((lVar40 - (Ipz->begin).y) * lVar13 + lVar38) - (long)(Ipz->begin).x);
      local_1b0 = q->p + (((lVar40 - (q->begin).y) * lVar15 + lVar38) - (long)(q->begin).x);
      lVar34 = q->nstride;
      iVar6 = (q->begin).z;
      pdVar16 = vcc->p;
      iVar7 = (vcc->begin).z;
      lVar24 = Ipz->kstride;
      lVar25 = Ipz->nstride;
      iVar26 = (Ipz->begin).z;
      local_d8 = Imz->p + (((lVar40 - (Imz->begin).y) * lVar14 + lVar38) - (long)(Imz->begin).x);
      lVar38 = Imz->kstride;
      lVar17 = Imz->nstride;
      iVar8 = (Imz->begin).z;
      iVar9 = (zebox->smallend).vect[2];
      iVar10 = (zebox->bigend).vect[0];
      iVar11 = (zebox->bigend).vect[1];
      lVar27 = vcc->kstride * 8;
      lVar39 = vcc->jstride * 8;
      lVar20 = q->kstride * 8;
      uVar29 = 0;
      do {
        iVar32 = iVar9;
        if (iVar9 <= iVar5) {
          do {
            if (iVar3 <= iVar11) {
              iVar19 = iVar32 - iVar6;
              iVar22 = iVar32 + -1;
              pdVar33 = (double *)((long)(iVar32 - iVar8) * lVar38 * 8 + (long)local_d8);
              pdVar28 = (double *)((long)(iVar22 - iVar26) * lVar24 * 8 + (long)local_1a8);
              lVar35 = (long)pdVar16 + (iVar22 - iVar7) * lVar27 + lVar36;
              lVar21 = (long)pdVar16 + (iVar32 - iVar7) * lVar27 + lVar36;
              pdVar23 = (double *)((iVar19 + -3) * lVar20 + (long)local_1b0);
              pdVar44 = (double *)((iVar19 + 2) * lVar20 + (long)local_1b0);
              pdVar45 = (double *)((iVar19 + -2) * lVar20 + (long)local_1b0);
              pdVar30 = (double *)(((iVar32 + 1) - iVar6) * lVar20 + (long)local_1b0);
              pdVar31 = (double *)((iVar22 - iVar6) * lVar20 + (long)local_1b0);
              pdVar43 = (double *)(iVar19 * lVar20 + (long)local_1b0);
              lVar42 = lVar40;
              do {
                if (iVar4 <= iVar10) {
                  lVar41 = 0;
                  do {
                    dVar1 = pdVar43[lVar41];
                    dVar2 = pdVar31[lVar41];
                    dVar65 = dVar2 - pdVar45[lVar41];
                    dVar67 = dVar1 - dVar2;
                    dVar77 = 0.0;
                    dVar53 = ABS(dVar65);
                    dVar54 = ABS(dVar67);
                    dVar73 = 0.0;
                    if (0.0 <= dVar67 * dVar65) {
                      dVar73 = dVar54;
                      if (dVar53 <= dVar54) {
                        dVar73 = dVar53;
                      }
                      dVar73 = dVar73 + dVar73;
                    }
                    dVar58 = pdVar44[lVar41] - pdVar30[lVar41];
                    dVar49 = pdVar30[lVar41] - dVar1;
                    if (0.0 <= dVar49 * dVar58) {
                      dVar77 = ABS(dVar58);
                      if (ABS(dVar49) <= ABS(dVar58)) {
                        dVar77 = ABS(dVar49);
                      }
                      dVar77 = dVar77 + dVar77;
                    }
                    dVar63 = 0.0;
                    dVar55 = 0.0;
                    if (0.0 <= dVar67 * dVar49) {
                      dVar55 = ABS(dVar49);
                      if (ABS(dVar67) <= ABS(dVar49)) {
                        dVar55 = ABS(dVar67);
                      }
                      dVar55 = dVar55 + dVar55;
                    }
                    dVar72 = pdVar45[lVar41] - pdVar23[lVar41];
                    if (0.0 <= dVar65 * dVar72) {
                      dVar63 = ABS(dVar65);
                      if (ABS(dVar72) <= ABS(dVar65)) {
                        dVar63 = ABS(dVar72);
                      }
                      dVar63 = dVar63 + dVar63;
                    }
                    dVar52 = 0.0;
                    dVar74 = 0.0;
                    if (0.0 <= dVar67 * dVar49) {
                      dVar74 = ABS(dVar49);
                      if (ABS(dVar67) <= ABS(dVar49)) {
                        dVar74 = ABS(dVar67);
                      }
                      dVar74 = dVar74 + dVar74;
                    }
                    if (0.0 <= dVar67 * dVar65) {
                      if (dVar53 <= dVar54) {
                        dVar54 = dVar53;
                      }
                      dVar52 = dVar54 + dVar54;
                    }
                    dVar72 = (dVar72 + dVar65) * 0.5;
                    dVar76 = (dVar49 + dVar67) * 0.5;
                    auVar56._0_8_ = ABS(dVar72);
                    auVar56._8_8_ = ABS(dVar76);
                    auVar57._8_8_ = dVar74;
                    auVar57._0_8_ = dVar63;
                    auVar57 = minpd(auVar56,auVar57);
                    dVar54 = *(double *)(lVar21 + lVar41 * 8);
                    dVar53 = (dVar65 + dVar67) * 0.5;
                    dVar65 = (dVar58 + dVar49) * 0.5;
                    auVar51._0_8_ = (ulong)dVar53 & 0x8000000000000000;
                    auVar51._8_8_ = (ulong)dVar65 & 0x8000000000000000;
                    auVar60._0_8_ = ABS(dVar53);
                    auVar60._8_8_ = ABS(dVar65);
                    auVar61._8_4_ = SUB84(dVar77,0);
                    auVar61._0_8_ = dVar73;
                    auVar61._12_4_ = (int)((ulong)dVar77 >> 0x20);
                    auVar61 = minpd(auVar60,auVar61);
                    dVar77 = SUB168(auVar51 | _DAT_00753000,0);
                    dVar73 = ABS(dVar76 * 1.3333333333333333 +
                                 (auVar61._8_8_ * SUB168(auVar51 | _DAT_00753000,8) +
                                 auVar61._0_8_ * dVar77) * -0.16666666666666666);
                    if (dVar55 <= dVar73) {
                      dVar73 = dVar55;
                    }
                    auVar62._0_8_ = (ulong)dVar72 & 0x8000000000000000;
                    auVar62._8_8_ = (ulong)dVar76 & 0x8000000000000000;
                    dVar65 = SUB168(auVar62 | _DAT_00753000,8);
                    dVar53 = ABS(dVar53 * 1.3333333333333333 +
                                 (auVar57._8_8_ * dVar65 +
                                 auVar57._0_8_ * SUB168(auVar62 | _DAT_00753000,0)) *
                                 -0.16666666666666666);
                    if (dVar52 <= dVar53) {
                      dVar53 = dVar52;
                    }
                    pdVar28[lVar41] =
                         dVar53 * dVar77 * (1.0 - *(double *)(lVar35 + lVar41 * 8) * dVar48) * 0.5 +
                         dVar2;
                    pdVar33[lVar41] = dVar65 * dVar73 * (-1.0 - dVar54 * dVar48) * 0.5 + dVar1;
                    lVar41 = lVar41 + 1;
                  } while ((iVar10 - iVar4) + 1 != (int)lVar41);
                }
                lVar42 = lVar42 + 1;
                pdVar33 = pdVar33 + lVar14;
                pdVar28 = pdVar28 + lVar13;
                lVar35 = lVar35 + lVar39;
                lVar21 = lVar21 + lVar39;
                pdVar23 = pdVar23 + lVar15;
                pdVar44 = pdVar44 + lVar15;
                pdVar45 = pdVar45 + lVar15;
                pdVar30 = pdVar30 + lVar15;
                pdVar31 = pdVar31 + lVar15;
                pdVar43 = pdVar43 + lVar15;
              } while (iVar11 + 1 != (int)lVar42);
            }
            iVar32 = iVar32 + 1;
          } while (iVar32 != iVar5 + 1);
        }
        uVar29 = uVar29 + 1;
        local_d8 = local_d8 + lVar17;
        local_1a8 = local_1a8 + lVar25;
        local_1b0 = local_1b0 + lVar34;
      } while (uVar29 != (uint)ncomp);
      return;
    }
    iVar5 = (zebox->smallend).vect[2];
  }
  if (0 < ncomp) {
    lVar13 = Ipz->jstride;
    lVar14 = Imz->jstride;
    iVar6 = (zebox->smallend).vect[1];
    lVar39 = (long)iVar6;
    iVar7 = (zebox->smallend).vect[0];
    lVar38 = (long)iVar7;
    lVar40 = vcc->nstride * 0x10 + (lVar39 - (vcc->begin).y) * vcc->jstride * 8 + lVar38 * 8 +
             (long)(vcc->begin).x * -8;
    lVar15 = q->jstride;
    lVar24 = (lVar39 - (q->begin).y) * lVar15;
    uVar12 = (q->begin).z;
    iVar26 = iVar4 - uVar12;
    lVar34 = q->kstride;
    lVar25 = (long)(q->begin).x;
    local_f0 = q->p;
    local_f8 = local_f0 + (((int)((iVar3 - uVar12) + 2) * lVar34 + lVar24 + lVar38) - lVar25);
    local_100 = local_f0 + (((int)(iVar3 - uVar12) * lVar34 + lVar24 + lVar38) - lVar25);
    local_108 = local_f0 + (((int)(~uVar12 + iVar3) * lVar34 + lVar24 + lVar38) - lVar25);
    local_110 = local_f0 + (((iVar26 + -2) * lVar34 + lVar24 + lVar38) - lVar25);
    local_118 = local_f0 + ((iVar26 * lVar34 + lVar24 + lVar38) - lVar25);
    local_120 = local_f0 + (((iVar26 + 1) * lVar34 + lVar24 + lVar38) - lVar25);
    local_f0 = local_f0 + ((lVar24 + lVar38) - lVar25);
    lVar24 = q->nstride;
    pdVar16 = vcc->p;
    iVar26 = (vcc->begin).z;
    local_208 = Imz->p + (((lVar39 - (Imz->begin).y) * lVar14 + lVar38) - (long)(Imz->begin).x);
    local_e8 = Ipz->p + (((lVar39 - (Ipz->begin).y) * lVar13 + lVar38) - (long)(Ipz->begin).x);
    lVar25 = Ipz->kstride;
    lVar38 = Ipz->nstride;
    iVar8 = (Ipz->begin).z;
    lVar17 = Imz->kstride;
    lVar20 = Imz->nstride;
    iVar9 = (Imz->begin).z;
    iVar10 = (zebox->bigend).vect[2];
    iVar11 = (zebox->bigend).vect[0];
    iVar32 = (zebox->bigend).vect[1];
    lVar36 = vcc->kstride * 8;
    lVar27 = vcc->jstride * 8;
    lVar34 = lVar34 * 8;
    uVar68 = 0;
    uVar70 = 0x3ff00000;
    local_190 = 0;
    do {
      iVar22 = iVar5;
      if (iVar5 <= iVar10) {
        do {
          if (iVar6 <= iVar32) {
            iVar19 = iVar22 - uVar12;
            iVar37 = iVar22 + -1;
            pdVar31 = (double *)((long)(iVar22 - iVar9) * lVar17 * 8 + (long)local_208);
            pdVar30 = (double *)((long)(iVar37 - iVar8) * lVar25 * 8 + (long)local_e8);
            lVar21 = (long)pdVar16 + (iVar37 - iVar26) * lVar36 + lVar40;
            lVar35 = (long)pdVar16 + (iVar22 - iVar26) * lVar36 + lVar40;
            local_1b8 = (double *)((int)(~uVar12 + iVar22) * lVar34 + (long)local_f0);
            pdVar44 = (double *)((iVar19 + -3) * lVar34 + (long)local_f0);
            pdVar33 = (double *)((iVar19 + 2) * lVar34 + (long)local_f0);
            pdVar28 = (double *)((int)((iVar22 + -2) - uVar12) * lVar34 + (long)local_f0);
            pdVar23 = (double *)((int)((iVar22 + 1) - uVar12) * lVar34 + (long)local_f0);
            pdVar45 = (double *)((int)(iVar37 - uVar12) * lVar34 + (long)local_f0);
            pdVar43 = (double *)(iVar19 * lVar34 + (long)local_f0);
            local_1c0 = local_120;
            local_1c8 = local_118;
            local_1d0 = local_110;
            local_220 = local_108;
            local_228 = local_100;
            local_230 = local_f8;
            lVar42 = lVar39;
            do {
              if (iVar7 <= iVar11) {
                bVar46 = pbc[local_190].bc[2] - 3U < 2;
                bVar47 = pbc[local_190].bc[5] - 3U < 2;
                lVar41 = 0;
                do {
                  dVar1 = pdVar43[lVar41];
                  dVar2 = pdVar45[lVar41];
                  dVar73 = pdVar28[lVar41];
                  dVar49 = dVar1 - dVar2;
                  dVar58 = dVar2 - dVar73;
                  dVar54 = 0.0;
                  dVar65 = (dVar49 + dVar58) * 0.5;
                  dVar53 = ABS(dVar49);
                  dVar67 = ABS(dVar58);
                  dVar77 = 0.0;
                  if (0.0 <= dVar49 * dVar58) {
                    dVar77 = dVar53;
                    if (dVar67 <= dVar53) {
                      dVar77 = dVar67;
                    }
                    dVar77 = dVar77 + dVar77;
                  }
                  dVar63 = pdVar23[lVar41];
                  dVar72 = dVar63 - dVar1;
                  dVar55 = pdVar33[lVar41] - dVar63;
                  dVar74 = (dVar72 + dVar55) * 0.5;
                  if (0.0 <= dVar72 * dVar55) {
                    dVar54 = ABS(dVar55);
                    if (ABS(dVar72) <= ABS(dVar55)) {
                      dVar54 = ABS(dVar72);
                    }
                    dVar54 = dVar54 + dVar54;
                  }
                  dVar52 = (dVar49 + dVar72) * 0.5;
                  dVar55 = 0.0;
                  if (0.0 <= dVar49 * dVar72) {
                    dVar55 = ABS(dVar72);
                    if (ABS(dVar49) <= ABS(dVar72)) {
                      dVar55 = ABS(dVar49);
                    }
                    dVar55 = dVar55 + dVar55;
                  }
                  dVar59 = (double)((ulong)dVar65 & 0x8000000000000000 | CONCAT44(uVar70,uVar68));
                  dVar76 = ABS(dVar65);
                  if (dVar77 <= ABS(dVar65)) {
                    dVar76 = dVar77;
                  }
                  dVar76 = dVar76 * dVar59;
                  dVar77 = (double)((ulong)dVar52 & 0x8000000000000000 | CONCAT44(uVar70,uVar68));
                  uVar29 = (ulong)DAT_00753000;
                  if (iVar3 == iVar22 && bVar46) {
                    dVar55 = 0.0;
                    if (0.0 <= (dVar49 + dVar49) * (dVar72 + dVar72)) {
                      dVar54 = ABS(dVar49 + dVar49);
                      dVar55 = ABS(dVar72 + dVar72);
                      if (dVar54 <= dVar55) {
                        dVar55 = dVar54;
                      }
                    }
                    dVar74 = pdVar33[lVar41] * -0.1 +
                             dVar63 * 0.6666666666666666 + dVar2 * -1.0666666666666667 + dVar1 * 0.5
                    ;
                    dVar54 = (double)((ulong)dVar74 & 0x8000000000000000 | uVar29);
                  }
                  else {
                    dVar75 = ABS(dVar74);
                    if (dVar54 <= dVar75) {
                      dVar75 = dVar54;
                    }
                    dVar75 = dVar75 * (double)((ulong)dVar74 & 0x8000000000000000 |
                                              CONCAT44(uVar70,uVar68));
                    dVar54 = dVar77;
                    if (iVar3 + 1 == iVar22 && bVar46) {
                      dVar74 = local_228[lVar41];
                      dVar64 = dVar74 - local_220[lVar41];
                      dVar76 = (dVar1 - dVar74) + (dVar1 - dVar74);
                      dVar64 = dVar64 + dVar64;
                      dVar66 = 0.0;
                      if (0.0 <= dVar64 * dVar76) {
                        dVar66 = ABS(dVar76);
                        dVar64 = ABS(dVar64);
                        if (dVar64 <= dVar66) {
                          dVar66 = dVar64;
                        }
                      }
                      dVar74 = local_230[lVar41] * -0.1 +
                               dVar1 * 0.6666666666666666 +
                               local_220[lVar41] * -1.0666666666666667 + dVar74 * 0.5;
                      dVar76 = ABS(dVar74);
                      if (dVar66 <= dVar76) {
                        dVar76 = dVar66;
                      }
                      dVar76 = dVar76 * (double)((ulong)dVar74 & 0x8000000000000000 | uVar29);
                      dVar74 = dVar52 * 1.3333333333333333 +
                               (dVar75 + dVar76) * -0.16666666666666666;
                    }
                    else {
                      dVar74 = dVar52 * 1.3333333333333333 +
                               (dVar76 + dVar75) * -0.16666666666666666;
                    }
                  }
                  dVar75 = *(double *)(lVar35 + lVar41 * 8);
                  if (iVar4 != iVar22 || !bVar47) {
                    if (iVar4 + -1 == iVar22 && bVar47) {
                      dVar74 = local_1c8[lVar41];
                      dVar66 = local_1c0[lVar41] - dVar74;
                      dVar66 = dVar66 + dVar66;
                      dVar64 = (dVar74 - dVar1) + (dVar74 - dVar1);
                      uVar68 = 0;
                      uVar70 = 0;
                      if (0.0 <= dVar64 * dVar66) {
                        dVar66 = ABS(dVar66);
                        dVar64 = ABS(dVar64);
                        if (dVar64 <= dVar66) {
                          dVar66 = dVar64;
                        }
                        uVar68 = SUB84(dVar66,0);
                        uVar70 = (undefined4)((ulong)dVar66 >> 0x20);
                      }
                      dVar66 = local_1d0[lVar41] * 0.1 +
                               dVar1 * -0.6666666666666666 +
                               local_1c0[lVar41] * 1.0666666666666667 + dVar74 * -0.5;
                      dVar74 = ABS(dVar66);
                      if ((double)CONCAT44(uVar70,uVar68) <= dVar74) {
                        dVar74 = (double)CONCAT44(uVar70,uVar68);
                      }
                      dVar74 = dVar52 * 1.3333333333333333 +
                               (dVar76 + dVar74 * (double)((ulong)dVar66 & 0x8000000000000000 |
                                                          uVar29)) * -0.16666666666666666;
                    }
                  }
                  else {
                    dVar55 = 0.0;
                    if (0.0 <= (dVar49 + dVar49) * (dVar72 + dVar72)) {
                      dVar54 = ABS(dVar49 + dVar49);
                      dVar55 = ABS(dVar72 + dVar72);
                      if (dVar54 <= dVar55) {
                        dVar55 = dVar54;
                      }
                    }
                    dVar74 = dVar73 * 0.1 +
                             dVar2 * -0.6666666666666666 +
                             dVar63 * 1.0666666666666667 + dVar1 * -0.5;
                    dVar54 = (double)((ulong)dVar74 & 0x8000000000000000 | uVar29);
                  }
                  dVar66 = dVar73 - pdVar44[lVar41];
                  dVar50 = (dVar58 + dVar66) * 0.5;
                  dVar76 = 0.0;
                  dVar64 = 0.0;
                  if (0.0 <= dVar58 * dVar66) {
                    dVar64 = ABS(dVar58);
                    if (ABS(dVar66) <= ABS(dVar58)) {
                      dVar64 = ABS(dVar66);
                    }
                    dVar64 = dVar64 + dVar64;
                  }
                  if (0.0 <= dVar49 * dVar72) {
                    dVar76 = ABS(dVar72);
                    if (ABS(dVar49) <= ABS(dVar72)) {
                      dVar76 = ABS(dVar49);
                    }
                    dVar76 = dVar76 + dVar76;
                  }
                  dVar66 = 0.0;
                  if (0.0 <= dVar49 * dVar58) {
                    if (dVar67 <= dVar53) {
                      dVar53 = dVar67;
                    }
                    dVar66 = dVar53 + dVar53;
                  }
                  dVar53 = ABS(dVar50);
                  if (dVar64 <= dVar53) {
                    dVar53 = dVar64;
                  }
                  dVar53 = dVar53 * (double)((ulong)dVar50 & 0x8000000000000000 | 0x3ff0000000000000
                                            );
                  uVar68 = (undefined4)DAT_00753000;
                  uVar70 = DAT_00753000._4_4_;
                  if (iVar37 == iVar3 && bVar46) {
                    dVar66 = 0.0;
                    if (0.0 <= (dVar58 + dVar58) * (dVar49 + dVar49)) {
                      dVar66 = ABS(dVar49 + dVar49);
                      dVar77 = ABS(dVar58 + dVar58);
                      if (dVar77 <= dVar66) {
                        dVar66 = dVar77;
                      }
                    }
                    dVar77 = dVar63 * -0.1 +
                             dVar1 * 0.6666666666666666 + dVar73 * -1.0666666666666667 + dVar2 * 0.5
                    ;
                    dVar59 = (double)((ulong)dVar77 & 0x8000000000000000 | uVar29);
                  }
                  else {
                    dVar67 = ABS(dVar52);
                    if (dVar76 <= ABS(dVar52)) {
                      dVar67 = dVar76;
                    }
                    if (iVar3 == iVar22 + -2 && bVar46) {
                      dVar53 = local_228[lVar41];
                      dVar76 = dVar53 - local_220[lVar41];
                      dVar52 = (dVar2 - dVar53) + (dVar2 - dVar53);
                      dVar76 = dVar76 + dVar76;
                      uVar69 = 0;
                      uVar71 = 0;
                      if (0.0 <= dVar76 * dVar52) {
                        dVar52 = ABS(dVar52);
                        dVar76 = ABS(dVar76);
                        if (dVar76 <= dVar52) {
                          dVar52 = dVar76;
                        }
                        uVar69 = SUB84(dVar52,0);
                        uVar71 = (undefined4)((ulong)dVar52 >> 0x20);
                      }
                      dVar52 = local_230[lVar41] * -0.1 +
                               dVar2 * 0.6666666666666666 +
                               local_220[lVar41] * -1.0666666666666667 + dVar53 * 0.5;
                      dVar53 = ABS(dVar52);
                      if ((double)CONCAT44(uVar71,uVar69) <= dVar53) {
                        dVar53 = (double)CONCAT44(uVar71,uVar69);
                      }
                      dVar53 = dVar53 * (double)((ulong)dVar52 & 0x8000000000000000 | uVar29);
                      dVar77 = dVar65 * 1.3333333333333333 +
                               (dVar77 * dVar67 + dVar53) * -0.16666666666666666;
                    }
                    else {
                      dVar77 = dVar65 * 1.3333333333333333 +
                               (dVar53 + dVar77 * dVar67) * -0.16666666666666666;
                      uVar68 = 0;
                      uVar70 = 0x3ff00000;
                    }
                  }
                  if (iVar37 == iVar4 && bVar47) {
                    dVar66 = 0.0;
                    if (0.0 <= (dVar58 + dVar58) * (dVar49 + dVar49)) {
                      dVar66 = ABS(dVar49 + dVar49);
                      dVar77 = ABS(dVar58 + dVar58);
                      if (dVar77 <= dVar66) {
                        dVar66 = dVar77;
                      }
                    }
                    dVar77 = pdVar44[lVar41] * 0.1 +
                             dVar73 * -0.6666666666666666 +
                             dVar1 * 1.0666666666666667 + dVar2 * -0.5;
                    dVar59 = (double)((ulong)dVar77 & 0x8000000000000000 | CONCAT44(uVar70,uVar68));
                  }
                  else if (iVar4 == iVar22 && bVar47) {
                    dVar67 = dVar1 - local_1b8[lVar41];
                    dVar67 = dVar67 + dVar67;
                    dVar77 = 0.0;
                    if (0.0 <= dVar67 * (dVar72 + dVar72)) {
                      dVar77 = ABS(dVar72 + dVar72);
                      dVar67 = ABS(dVar67);
                      if (dVar67 <= dVar77) {
                        dVar77 = dVar67;
                      }
                    }
                    dVar67 = dVar73 * 0.1 +
                             local_1b8[lVar41] * -0.6666666666666666 +
                             dVar63 * 1.0666666666666667 + dVar1 * -0.5;
                    dVar73 = ABS(dVar67);
                    if (dVar77 <= dVar73) {
                      dVar73 = dVar77;
                    }
                    dVar77 = dVar65 * 1.3333333333333333 +
                             (dVar53 + dVar73 * (double)((ulong)dVar67 & 0x8000000000000000 |
                                                        CONCAT44(uVar70,uVar68))) *
                             -0.16666666666666666;
                  }
                  dVar73 = ABS(dVar74);
                  if (dVar55 <= ABS(dVar74)) {
                    dVar73 = dVar55;
                  }
                  dVar53 = ABS(dVar77);
                  if (dVar66 <= ABS(dVar77)) {
                    dVar53 = dVar66;
                  }
                  pdVar30[lVar41] =
                       dVar53 * dVar59 * (1.0 - *(double *)(lVar21 + lVar41 * 8) * dVar48) * 0.5 +
                       dVar2;
                  pdVar31[lVar41] = dVar54 * dVar73 * (-1.0 - dVar75 * dVar48) * 0.5 + dVar1;
                  lVar41 = lVar41 + 1;
                } while ((iVar11 - iVar7) + 1 != (int)lVar41);
              }
              lVar42 = lVar42 + 1;
              pdVar31 = pdVar31 + lVar14;
              pdVar30 = pdVar30 + lVar13;
              lVar21 = lVar21 + lVar27;
              lVar35 = lVar35 + lVar27;
              local_230 = local_230 + lVar15;
              local_228 = local_228 + lVar15;
              local_220 = local_220 + lVar15;
              local_1d0 = local_1d0 + lVar15;
              local_1c8 = local_1c8 + lVar15;
              local_1c0 = local_1c0 + lVar15;
              local_1b8 = local_1b8 + lVar15;
              pdVar44 = pdVar44 + lVar15;
              pdVar33 = pdVar33 + lVar15;
              pdVar28 = pdVar28 + lVar15;
              pdVar23 = pdVar23 + lVar15;
              pdVar45 = pdVar45 + lVar15;
              pdVar43 = pdVar43 + lVar15;
            } while (iVar32 + 1 != (int)lVar42);
          }
          iVar22 = iVar22 + 1;
        } while (iVar22 != iVar10 + 1);
      }
      local_190 = local_190 + 1;
      local_208 = local_208 + lVar20;
      local_e8 = local_e8 + lVar38;
      local_f8 = local_f8 + lVar24;
      local_100 = local_100 + lVar24;
      local_108 = local_108 + lVar24;
      local_110 = local_110 + lVar24;
      local_118 = local_118 + lVar24;
      local_120 = local_120 + lVar24;
      local_f0 = local_f0 + lVar24;
    } while (local_190 != (uint)ncomp);
  }
  return;
}

Assistant:

void
PLM::PredictVelOnZFace ( Box const& zebox, int ncomp,
                         Array4<Real> const& Imz, Array4<Real> const& Ipz,
                         Array4<Real const> const& q,
                         Array4<Real const> const& vcc,
                         const Geometry& geom,
                         Real dt,
                         Vector<BCRec> const& h_bcrec,
                         BCRec const* pbc)
{
    const Real dz = geom.CellSize(2);
    const Real dtdz = dt/dz;

    const Box& domain_box = geom.Domain();
    const int domain_klo = domain_box.smallEnd(2);
    const int domain_khi = domain_box.bigEnd(2);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo = extdir_lohi.first;
    bool has_extdir_or_ho_hi = extdir_lohi.second;

    if ((has_extdir_or_ho_lo && domain_klo >= zebox.smallEnd(2)-1) ||
        (has_extdir_or_ho_hi && domain_khi <= zebox.bigEnd(2)))
    {
        amrex::ParallelFor(zebox, ncomp, [q,vcc,domain_klo,domain_khi,Ipz,Imz,dtdz,pbc]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            const auto& bc = pbc[n];
            bool extdir_or_ho_klo = (bc.lo(2) == BCType::ext_dir) ||
                                    (bc.lo(2) == BCType::hoextrap);
            bool extdir_or_ho_khi = (bc.hi(2) == BCType::ext_dir) ||
                                    (bc.hi(2) == BCType::hoextrap);

            int order = 4;

            Real wpls = q(i,j,k  ,n) + 0.5 * (-1.0 - vcc(i,j,k  ,2) * dtdz) *
                amrex_calc_zslope_extdir(i,j,k,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);
            Real wmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - vcc(i,j,k-1,2) * dtdz) *
                amrex_calc_zslope_extdir(i,j,k-1,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);


            Ipz(i,j,k-1,n) = wmns;
            Imz(i,j,k  ,n) = wpls;
        });
    }
    else
    {
        amrex::ParallelFor(zebox, ncomp, [q,vcc,Ipz,Imz,dtdz]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            int order = 4;

            Real wpls = q(i,j,k  ,n) + 0.5 * (-1.0 - vcc(i,j,k  ,2) * dtdz) *
                amrex_calc_zslope(i,j,k  ,n,order,q);
            Real wmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - vcc(i,j,k-1,2) * dtdz) *
                amrex_calc_zslope(i,j,k-1,n,order,q);

            Ipz(i,j,k-1,n) = wmns;
            Imz(i,j,k  ,n) = wpls;
        });
    }
}